

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForInstallTree
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          string *installPrefix)

{
  cmMakefile *this_00;
  cmLocalGenerator *lg;
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  allocator<char> local_179;
  cmAlphaNum local_178;
  cmAlphaNum local_148;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string *local_98;
  allocator<char> local_89;
  string local_88;
  cmValue local_68;
  cmValue install_name_dir;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *installPrefix_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *dir;
  
  this_00 = this->Makefile;
  local_28 = installPrefix;
  installPrefix_local = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_49);
  bVar1 = cmMakefile::IsOn(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    install_name_dir.Value._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"INSTALL_NAME_DIR",&local_89);
    local_68 = GetProperty(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    bVar1 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_INSTALL);
    if (bVar1) {
      local_98 = local_68.Value;
      bVar1 = cmNonempty(local_68);
      if (bVar1) {
        psVar2 = cmValue::operator*[abi_cxx11_(&local_68);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar2);
        cmGeneratorExpression::ReplaceInstallPrefix(__return_storage_ptr__,local_28);
        std::__cxx11::string::string((string *)&local_d8,(string *)__return_storage_ptr__);
        psVar2 = installPrefix_local;
        lg = this->LocalGenerator;
        std::__cxx11::string::string((string *)&local_f8);
        cmGeneratorExpression::Evaluate
                  (&local_b8,&local_d8,lg,psVar2,(cmGeneratorTarget *)0x0,
                   (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_f8);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_d8);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          cmAlphaNum::cmAlphaNum(&local_148,__return_storage_ptr__);
          cmAlphaNum::cmAlphaNum(&local_178,'/');
          cmStrCat<>(&local_118,&local_148,&local_178);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_118);
          std::__cxx11::string::~string((string *)&local_118);
        }
      }
    }
    bVar1 = cmValue::operator_cast_to_bool(&local_68);
    if ((!bVar1) && (bVar1 = MacOSXRpathInstallNameDirDefault(this), bVar1)) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"@rpath/");
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_179);
    std::allocator<char>::~allocator(&local_179);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForInstallTree(
  const std::string& config, const std::string& installPrefix) const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    std::string dir;
    cmValue install_name_dir = this->GetProperty("INSTALL_NAME_DIR");

    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_INSTALL)) {
      if (cmNonempty(install_name_dir)) {
        dir = *install_name_dir;
        cmGeneratorExpression::ReplaceInstallPrefix(dir, installPrefix);
        dir =
          cmGeneratorExpression::Evaluate(dir, this->LocalGenerator, config);
        if (!dir.empty()) {
          dir = cmStrCat(dir, '/');
        }
      }
    }
    if (!install_name_dir) {
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath/";
      }
    }
    return dir;
  }
  return "";
}